

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::writeToBinary(Binasc *this,ostream *out,istream *input)

{
  byte bVar1;
  int iVar2;
  allocator local_451;
  string local_450 [32];
  int local_430;
  int local_42c;
  int status;
  int lineNum;
  char inputLine [1024];
  istream *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  inputLine._1016_8_ = input;
  memset(&status,0,0x400);
  local_42c = 0;
  std::istream::getline((char *)inputLine._1016_8_,(long)&status,'\0');
  while( true ) {
    local_42c = local_42c + 1;
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      return 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,(char *)&status,&local_451);
    iVar2 = processLine(this,out,(string *)local_450,local_42c);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    if (iVar2 == 0) break;
    local_430 = iVar2;
    std::istream::getline((char *)inputLine._1016_8_,(long)&status,'\0');
  }
  return 0;
}

Assistant:

int Binasc::writeToBinary(std::ostream& out, std::istream& input) {
	char inputLine[1024] = {0};    // current line being processed
	int  lineNum = 0;              // current line number

	input.getline(inputLine, 1024, '\n');
	lineNum++;
	while (!input.eof()) {
		int status = processLine(out, inputLine, lineNum);
		if (!status) {
			return 0;
		}
		input.getline(inputLine, 1024, '\n');
		lineNum++;
	}
	return 1;
}